

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std.cpp
# Opt level: O3

char * lib_alloc_str(size_t len)

{
  char *pcVar1;
  
  pcVar1 = (char *)malloc(len + 1);
  *pcVar1 = '\0';
  return pcVar1;
}

Assistant:

char *lib_alloc_str(size_t len)
{
    char *buf;

    /* allocate the space */
    buf = (char *)t3malloc(len + 1);

    /* make sure it's initially null-terminated */
    buf[0] = '\0';

    /* return the space */
    return buf;
}